

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

void OCSBtest(double *x,int N,int f,int mlags,char *method,double *statistics,double *critical)

{
  double *pdVar1;
  size_t __size;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *__ptr;
  double *__ptr_00;
  reg_object prVar5;
  reg_object prVar6;
  void *__ptr_01;
  ulong uVar7;
  char *__s;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  __size = (long)mlags * 8;
  __ptr = malloc(__size);
  __ptr_00 = (double *)malloc(__size);
  if ((mlags < 1) || (iVar3 = strcmp(method,"fixed"), iVar3 == 0)) {
    prVar5 = (reg_object)0x0;
    iVar3 = mlags;
  }
  else {
    for (uVar8 = 1; mlags + 1 != uVar8; uVar8 = uVar8 + 1) {
      prVar5 = fitOCSB(x,N,f,(int)uVar8,mlags);
      *(reg_object *)((long)__ptr + uVar8 * 8 + -8) = prVar5;
      iVar3 = strcmp(method,"aic");
      lVar9 = 0x98;
      if ((iVar3 != 0) && (iVar3 = strcmp(method,"AIC"), iVar3 != 0)) {
        iVar3 = strcmp(method,"bic");
        lVar9 = 0xa0;
        if ((iVar3 != 0) && (iVar3 = strcmp(method,"BIC"), iVar3 != 0)) {
          iVar3 = strcmp(method,"aicc");
          lVar9 = 0xa8;
          if ((iVar3 != 0) && (iVar3 = strcmp(method,"AICc"), iVar3 != 0)) {
            __s = "Only three criterions are accepted - aic, bic and aicc ";
            goto LAB_001472de;
          }
        }
      }
      __ptr_00[uVar8 - 1] = *(double *)((long)prVar5->R2 + lVar9 + -0x38);
    }
    uVar8 = 0;
    do {
      if ((uint)mlags == uVar8) {
        __s = "All lag values up to \'maxlag\' produced singular matrices. Use different method. ";
        goto LAB_001472de;
      }
      pdVar1 = __ptr_00 + uVar8;
      uVar8 = uVar8 + 1;
    } while (NAN(*pdVar1));
    dVar10 = *__ptr_00;
    iVar3 = -(uint)NAN(dVar10);
    dVar10 = (double)(~-(ulong)(!NAN(dVar10) && !NAN(dVar10)) & 0x7fefffffffffffff |
                     -(ulong)(!NAN(dVar10) && !NAN(dVar10)) & (ulong)dVar10);
    for (lVar9 = 1; mlags != lVar9; lVar9 = lVar9 + 1) {
      dVar11 = __ptr_00[lVar9];
      iVar2 = (int)lVar9;
      if (dVar10 <= dVar11) {
        dVar11 = dVar10;
        iVar2 = iVar3;
      }
      iVar3 = iVar2;
      dVar10 = dVar11;
    }
    prVar5 = *(reg_object *)((long)__ptr + (long)iVar3 * 8);
    iVar3 = iVar3 + -1;
  }
  prVar6 = fitOCSB(x,N,f,iVar3,iVar3);
  uVar4 = prVar6->rank;
  if (uVar4 != prVar6->p) {
    if (prVar5 == (reg_object)0x0) {
      __s = "Could not find a solution. Try a different method. ";
LAB_001472de:
      puts(__s);
      exit(-1);
    }
    uVar4 = prVar5->p;
    prVar6 = prVar5;
  }
  __ptr_01 = malloc((long)(int)uVar4 * 8);
  uVar7 = 0;
  uVar8 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 * 8 != uVar7; uVar7 = uVar7 + 8) {
    *(double *)((long)__ptr_01 + uVar7) =
         *(double *)((long)&prVar6->beta[0].value + uVar7 * 4) /
         *(double *)((long)&prVar6->beta[0].stdErr + uVar7 * 4);
  }
  uVar7 = 0;
  uVar8 = (ulong)(uint)mlags;
  if (mlags < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    free_reg(*(reg_object *)((long)__ptr + uVar7 * 8));
  }
  dVar10 = log((double)f);
  dVar10 = dVar10 + -0.7656451;
  dVar10 = exp(dVar10 * -0.2850853 + dVar10 * dVar10 * -0.05983644);
  *critical = dVar10 * -0.2937411 + -1.652202;
  *statistics = *(double *)((long)__ptr_01 + (long)prVar6->p * 8 + -8);
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void OCSBtest(double *x, int N, int f, int mlags, const char *method,double *statistics,double *critical) {
    int i, bestindex,allnans,maxlag;
    double *tval,*icvals;
    reg_object fit;
    reg_object *list = (reg_object*)malloc(sizeof(reg_object)*mlags);
    reg_object crit_reg = NULL;

    icvals = (double*) malloc(sizeof(double)*mlags);

    maxlag = mlags;
    if (mlags > 0 && strcmp(method,"fixed")) {

        for(i = 1; i <= mlags;++i) {
            list[i-1] = fitOCSB(x,N,f,i,mlags);
            icvals[i-1] = getCVal(list[i-1],method);
            //printf("icvals %g",icvals[i-1]);
        }

        allnans = checkAllNans(icvals,mlags);

        if (allnans == 1) {
            printf("All lag values up to 'maxlag' produced singular matrices. Use different method. \n");
            exit(-1);
        }

        bestindex = getBestIndex(icvals,mlags);
        maxlag = bestindex-1;
        crit_reg = list[bestindex];

    }

    /* if (maxlag <= 0) {
        fit = crit_reg;
    } else {
        fit = fitOCSB(x,N,f,maxlag,maxlag);

        if (fit->rank != fit->p && fit->rank == fit->rank) {
            if (crit_reg == NULL) {
                printf("Could not find a solution. Try a different method. \n");
                exit(-1);
            } else {
                fit = crit_reg;
            }
        }
    } */

    fit = fitOCSB(x,N,f,maxlag,maxlag);

    //printf("\n\n%d\n\n",fit->rank);

    if (fit->rank != fit->p && fit->rank == fit->rank) {
        if (crit_reg == NULL) {
            printf("Could not find a solution. Try a different method. \n");
            exit(-1);
        } else {
            fit = crit_reg;
        }
    }

    tval = (double*) malloc(sizeof(double)*fit->p);

    for(i = 0; i < fit->p; ++i) {
		tval[i] = (fit->beta+i)->value/(fit->beta+i)->stdErr;
	}

    //mdisplay(tval,1,fit->p);

    for(i = 0; i < mlags;++i) {
		free_reg(list[i]);
    }

    *critical = calcOCSBCritVal(f);
    *statistics = tval[fit->p-1];

    free(list);
    free(icvals);
    free(tval);
}